

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::EAMParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::EAMParameters> *this,string *id,EAMParameters *data)

{
  GenericData::GenericData(&this->super_GenericData,id);
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_002c02e8;
  EAMParameters::EAMParameters(&this->data_,data);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}